

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqrtx.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar2 = 4;
  do {
    iVar5 = (iVar2 + iVar4) / 2;
    iVar1 = iVar5 + 1;
    if (9 < (uint)(iVar5 * iVar5)) {
      iVar1 = iVar4;
      iVar2 = iVar5 + -1;
    }
    iVar4 = iVar1;
  } while (iVar4 <= iVar2);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4 + -1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar2 = 5;
  iVar4 = 0;
  do {
    iVar5 = (iVar2 + iVar4) / 2;
    iVar1 = iVar5 + 1;
    if (10 < (uint)(iVar5 * iVar5)) {
      iVar1 = iVar4;
      iVar2 = iVar5 + -1;
    }
    iVar4 = iVar1;
  } while (iVar4 <= iVar2);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4 + -1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	Solution solution;

	cout << solution.mySqrt(0) << endl;
	cout << solution.mySqrt(1) << endl;
	cout << solution.mySqrt(2) << endl;
	cout << solution.mySqrt(3) << endl;
	cout << solution.mySqrt(4) << endl;

	cout << solution.mySqrt(9) << endl;
	cout << solution.mySqrt(10) << endl;

	return 0;
}